

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O3

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunc
          (BlendMaskStateMachine *this,GLenum src,GLenum dst)

{
  pointer pBVar1;
  GLenum *pGVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  (*this->gl->blendFunc)(src,dst);
  pBVar1 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->state).
                super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1;
  if (lVar3 != 0) {
    pGVar2 = &pBVar1->func_dst_a;
    uVar4 = 1;
    do {
      pGVar2[-3] = src;
      pGVar2[-2] = src;
      pGVar2[-1] = dst;
      *pGVar2 = dst;
      uVar5 = (ulong)uVar4;
      pGVar2 = pGVar2 + 8;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (ulong)(lVar3 >> 5));
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendFunc(glw::GLenum src, glw::GLenum dst)
{
	// all draw buffers
	gl.blendFunc(src, dst);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].func_src_rgb = src;
		state[i].func_src_a   = src;
		state[i].func_dst_rgb = dst;
		state[i].func_dst_a   = dst;
	}
}